

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O0

void aiMaterial::CopyPropertyList(aiMaterial *pcDest,aiMaterial *pcSrc)

{
  uint uVar1;
  aiMaterialProperty **ppaVar2;
  aiMaterialProperty *rOther;
  undefined1 auVar3 [16];
  bool bVar4;
  ulong uVar5;
  aiMaterialProperty **ppaVar6;
  aiMaterialProperty *paVar7;
  char *pcVar8;
  uint local_44;
  uint q;
  aiMaterialProperty *prop;
  aiMaterialProperty *propSrc;
  uint i_1;
  uint i;
  aiMaterialProperty **pcOld;
  uint iOldNum;
  aiMaterial *pcSrc_local;
  aiMaterial *pcDest_local;
  
  if (pcDest == (aiMaterial *)0x0) {
    __assert_fail("__null != pcDest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,0x248,
                  "static void aiMaterial::CopyPropertyList(aiMaterial *, const aiMaterial *)");
  }
  if (pcSrc == (aiMaterial *)0x0) {
    __assert_fail("__null != pcSrc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,0x249,
                  "static void aiMaterial::CopyPropertyList(aiMaterial *, const aiMaterial *)");
  }
  uVar1 = pcDest->mNumProperties;
  pcDest->mNumAllocated = pcSrc->mNumAllocated + pcDest->mNumAllocated;
  pcDest->mNumProperties = pcSrc->mNumProperties + pcDest->mNumProperties;
  ppaVar2 = pcDest->mProperties;
  auVar3 = ZEXT416(pcDest->mNumAllocated) * ZEXT816(8);
  uVar5 = auVar3._0_8_;
  if (auVar3._8_8_ != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppaVar6 = (aiMaterialProperty **)operator_new__(uVar5);
  pcDest->mProperties = ppaVar6;
  if ((uVar1 != 0) && (ppaVar2 != (aiMaterialProperty **)0x0)) {
    for (propSrc._4_4_ = 0; propSrc._4_4_ < uVar1; propSrc._4_4_ = propSrc._4_4_ + 1) {
      pcDest->mProperties[propSrc._4_4_] = ppaVar2[propSrc._4_4_];
    }
  }
  propSrc._0_4_ = uVar1;
  if ((ppaVar2 != (aiMaterialProperty **)0x0) && (ppaVar2 != (aiMaterialProperty **)0x0)) {
    operator_delete__(ppaVar2);
  }
  for (; (uint)propSrc < pcDest->mNumProperties; propSrc._0_4_ = (uint)propSrc + 1) {
    rOther = pcSrc->mProperties[(uint)propSrc];
    for (local_44 = 0; local_44 < uVar1; local_44 = local_44 + 1) {
      paVar7 = pcDest->mProperties[local_44];
      if ((((paVar7 != (aiMaterialProperty *)0x0) &&
           (bVar4 = aiString::operator==(&paVar7->mKey,&rOther->mKey), bVar4)) &&
          (paVar7->mSemantic == rOther->mSemantic)) && (paVar7->mIndex == rOther->mIndex)) {
        if (paVar7 != (aiMaterialProperty *)0x0) {
          aiMaterialProperty::~aiMaterialProperty(paVar7);
          operator_delete(paVar7);
        }
        memmove(pcDest->mProperties + local_44,pcDest->mProperties + (local_44 + 1),
                (ulong)((uint)propSrc - local_44));
        propSrc._0_4_ = (uint)propSrc - 1;
        pcDest->mNumProperties = pcDest->mNumProperties - 1;
      }
    }
    paVar7 = (aiMaterialProperty *)operator_new(0x420);
    aiMaterialProperty::aiMaterialProperty(paVar7);
    pcDest->mProperties[(uint)propSrc] = paVar7;
    aiString::operator=((aiString *)paVar7,&rOther->mKey);
    paVar7->mDataLength = rOther->mDataLength;
    paVar7->mType = rOther->mType;
    paVar7->mSemantic = rOther->mSemantic;
    paVar7->mIndex = rOther->mIndex;
    pcVar8 = (char *)operator_new__((ulong)rOther->mDataLength);
    paVar7->mData = pcVar8;
    memcpy(paVar7->mData,rOther->mData,(ulong)paVar7->mDataLength);
  }
  return;
}

Assistant:

void aiMaterial::CopyPropertyList(aiMaterial* pcDest,
    const aiMaterial* pcSrc
    )
{
    ai_assert(NULL != pcDest);
    ai_assert(NULL != pcSrc);

    unsigned int iOldNum = pcDest->mNumProperties;
    pcDest->mNumAllocated += pcSrc->mNumAllocated;
    pcDest->mNumProperties += pcSrc->mNumProperties;

    aiMaterialProperty** pcOld = pcDest->mProperties;
    pcDest->mProperties = new aiMaterialProperty*[pcDest->mNumAllocated];

    if (iOldNum && pcOld)   {
        for (unsigned int i = 0; i < iOldNum;++i) {
            pcDest->mProperties[i] = pcOld[i];
        }
    }

    if ( pcOld ) {
        delete[] pcOld;
    }

    for (unsigned int i = iOldNum; i< pcDest->mNumProperties;++i)   {
        aiMaterialProperty* propSrc = pcSrc->mProperties[i];

        // search whether we have already a property with this name -> if yes, overwrite it
        aiMaterialProperty* prop;
        for ( unsigned int q = 0; q < iOldNum; ++q ) {
            prop = pcDest->mProperties[q];
            if (prop /* just for safety */ && prop->mKey == propSrc->mKey && prop->mSemantic == propSrc->mSemantic
                && prop->mIndex == propSrc->mIndex) {
                delete prop;

                // collapse the whole array ...
                memmove(&pcDest->mProperties[q],&pcDest->mProperties[q+1],i-q);
                i--;
                pcDest->mNumProperties--;
            }
        }

        // Allocate the output property and copy the source property
        prop = pcDest->mProperties[i] = new aiMaterialProperty();
        prop->mKey = propSrc->mKey;
        prop->mDataLength = propSrc->mDataLength;
        prop->mType = propSrc->mType;
        prop->mSemantic = propSrc->mSemantic;
        prop->mIndex = propSrc->mIndex;

        prop->mData = new char[propSrc->mDataLength];
        memcpy(prop->mData,propSrc->mData,prop->mDataLength);
    }
}